

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIterator.cpp
# Opt level: O0

void __thiscall
OnDiskIterator::OnDiskIterator
          (OnDiskIterator *this,DatabaseName *name,DatabaseName *datafile_name,uint64_t total_files,
          uint64_t byte_offset,uint64_t file_offset,time_t last_read_time)

{
  DatabaseName *in_RCX;
  long in_RDI;
  DatabaseName *in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  
  DatabaseName::DatabaseName(in_RCX,in_R8);
  DatabaseName::DatabaseName(in_RCX,in_R8);
  *(DatabaseName **)(in_RDI + 0x140) = in_RCX;
  *(DatabaseName **)(in_RDI + 0x148) = in_R8;
  *(undefined8 *)(in_RDI + 0x150) = in_R9;
  *(undefined8 *)(in_RDI + 0x158) = in_stack_00000008;
  return;
}

Assistant:

OnDiskIterator::OnDiskIterator(const DatabaseName &name,
                               const DatabaseName &datafile_name,
                               uint64_t total_files, uint64_t byte_offset,
                               uint64_t file_offset, std::time_t last_read_time)
    : name(name),
      datafile_name(datafile_name),
      total_files(total_files),
      byte_offset(byte_offset),
      file_offset(file_offset),
      last_read_time(last_read_time) {}